

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# i2p_tests.cpp
# Opt level: O3

void __thiscall i2p_tests::listen_ok_accept_fail::test_method(listen_ok_accept_fail *this)

{
  string message;
  string message_00;
  string message_01;
  string message_02;
  MatchFn match;
  MatchFn match_00;
  MatchFn match_01;
  MatchFn match_02;
  _Manager_type p_Var1;
  bool bVar2;
  long lVar3;
  iterator in_R8;
  iterator pvVar4;
  iterator in_R9;
  iterator pvVar5;
  long in_FS_OFFSET;
  const_string file;
  const_string file_00;
  const_string msg;
  const_string msg_00;
  size_t num_sockets;
  _Any_data __tmp;
  DebugLogHelper debugloghelper25;
  DebugLogHelper debugloghelper24;
  DebugLogHelper debugloghelper23;
  DebugLogHelper debugloghelper22;
  Session session;
  CThreadInterrupt interrupt;
  undefined4 in_stack_fffffffffffffa38;
  undefined4 in_stack_fffffffffffffa3c;
  check_type cVar6;
  char *in_stack_fffffffffffffa50;
  char *in_stack_fffffffffffffa58;
  undefined1 *in_stack_fffffffffffffa60;
  _Manager_type in_stack_fffffffffffffa68;
  char *in_stack_fffffffffffffa70;
  char *local_580;
  char *local_578;
  char *local_570;
  char *local_568;
  lazy_ostream local_560;
  undefined1 *local_550;
  char **local_548;
  assertion_result local_540;
  undefined1 *local_528;
  undefined1 *local_520;
  char *local_518;
  char *local_510;
  undefined8 local_508;
  undefined8 uStack_500;
  code *local_4f8;
  code *local_4f0;
  undefined8 local_4e8;
  undefined8 uStack_4e0;
  code *local_4d8;
  code *local_4d0;
  undefined8 local_4c8;
  undefined8 uStack_4c0;
  code *local_4b8;
  code *local_4b0;
  undefined8 local_4a8;
  undefined8 uStack_4a0;
  code *local_498;
  code *local_490;
  undefined8 local_480 [3];
  long *local_468 [2];
  long local_458 [2];
  DebugLogHelper local_448;
  long *local_3f8 [2];
  long local_3e8 [2];
  DebugLogHelper local_3d8;
  long *local_388 [2];
  long local_378 [2];
  DebugLogHelper local_368;
  long *local_318 [2];
  long local_308 [2];
  DebugLogHelper local_2f8;
  Connection local_2a8;
  path local_250;
  anon_union_16_3_a3f0114d_for___in6_u local_228;
  _Manager_type local_218;
  _Invoker_type local_210;
  direct_or_indirect local_110;
  uint local_100;
  undefined8 local_f8;
  undefined2 local_f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_e8;
  undefined8 local_e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d8;
  undefined2 local_c8;
  direct_or_indirect local_c0;
  uint local_b0;
  undefined8 local_a8;
  undefined2 local_a0;
  CThreadInterrupt local_98;
  long local_38;
  
  p_Var1 = CreateSock.super__Function_base._M_manager;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_480[0] = 0;
  local_228._0_7_ =
       (undefined7)CreateSock.super__Function_base._M_functor._M_unused._M_member_pointer;
  local_228.__u6_addr8[7] =
       (uint8_t)((ulong)CreateSock.super__Function_base._M_functor._0_8_ >> 0x38);
  local_228._8_7_ = (undefined7)CreateSock.super__Function_base._M_functor._8_8_;
  local_228.__u6_addr8[0xf] =
       (uint8_t)((ulong)CreateSock.super__Function_base._M_functor._8_8_ >> 0x38);
  local_218 = CreateSock.super__Function_base._M_manager;
  CreateSock.super__Function_base._M_manager =
       std::
       _Function_handler<std::unique_ptr<Sock,_std::default_delete<Sock>_>_(int,_int,_int),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/i2p_tests.cpp:71:18)>
       ::_M_manager;
  local_210 = CreateSock._M_invoker;
  CreateSock._M_invoker =
       std::
       _Function_handler<std::unique_ptr<Sock,_std::default_delete<Sock>_>_(int,_int,_int),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/i2p_tests.cpp:71:18)>
       ::_M_invoke;
  CreateSock.super__Function_base._M_functor._M_unused._M_object = local_480;
  CreateSock.super__Function_base._M_functor._8_8_ = 0;
  if (p_Var1 != (_Manager_type)0x0) {
    (*p_Var1)((_Any_data *)&local_228,(_Any_data *)&local_228,__destroy_functor);
  }
  CThreadInterrupt::CThreadInterrupt(&local_98);
  local_228._8_7_ = 0;
  local_228._0_7_ = 0;
  local_228.__u6_addr8[7] = '\0';
  local_228.__u6_addr8[0xf] = '\x01';
  CService::CService((CService *)&local_c0.indirect_contents,(in6_addr *)&local_228,0x1de8);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_110.indirect_contents,
             (prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_c0.indirect_contents);
  local_e8 = &local_d8;
  local_f8 = local_a8;
  local_f0 = local_a0;
  local_e0 = 0;
  local_d8._M_local_buf[0] = '\0';
  local_c8 = 0;
  ArgsManager::GetDataDir((path *)&local_250,&gArgs,true);
  std::filesystem::__cxx11::path::_M_append(&local_250,0x14,"test_i2p_private_key");
  std::filesystem::__cxx11::path::path((path *)&local_2a8,&local_250);
  i2p::sam::Session::Session
            ((Session *)&local_228,(path *)&local_2a8,(Proxy *)&local_110.indirect_contents,
             &local_98);
  std::filesystem::__cxx11::path::~path((path *)&local_2a8);
  std::filesystem::__cxx11::path::~path(&local_250);
  local_2a8.sock._M_t.super___uniq_ptr_impl<Sock,_std::default_delete<Sock>_>._M_t.
  super__Tuple_impl<0UL,_Sock_*,_std::default_delete<Sock>_>.super__Head_base<0UL,_Sock_*,_false>.
  _M_head_impl = (__uniq_ptr_data<Sock,_std::default_delete<Sock>,_true,_true>)
                 (__uniq_ptr_impl<Sock,_std::default_delete<Sock>_>)0x0;
  CService::CService(&local_2a8.me);
  CService::CService(&local_2a8.peer);
  lVar3 = 5;
  do {
    local_318[0] = local_308;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_318,"Creating persistent SAM session","");
    local_4a8 = 0;
    uStack_4a0 = 0;
    local_490 = std::
                _Function_handler<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*),_DebugLogHelper::(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util/logging.h:35:66)>
                ::_M_invoke;
    local_498 = std::
                _Function_handler<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*),_DebugLogHelper::(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util/logging.h:35:66)>
                ::_M_manager;
    message._M_dataplus._M_p._4_4_ = in_stack_fffffffffffffa3c;
    message._M_dataplus._M_p._0_4_ = in_stack_fffffffffffffa38;
    message._M_string_length = (size_type)_cVar6;
    message.field_2._M_allocated_capacity = lVar3;
    message.field_2._8_8_ = in_stack_fffffffffffffa50;
    match.super__Function_base._M_functor._8_8_ = in_stack_fffffffffffffa60;
    match.super__Function_base._M_functor._M_unused._M_object = in_stack_fffffffffffffa58;
    match.super__Function_base._M_manager = in_stack_fffffffffffffa68;
    match._M_invoker = (_Invoker_type)in_stack_fffffffffffffa70;
    DebugLogHelper::DebugLogHelper(&local_2f8,message,match);
    if (local_498 != (code *)0x0) {
      (*local_498)(&local_4a8,&local_4a8,3);
    }
    if (local_318[0] != local_308) {
      operator_delete(local_318[0],local_308[0] + 1);
    }
    local_388[0] = local_378;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_388,"Persistent SAM session","")
    ;
    local_4c8 = 0;
    uStack_4c0 = 0;
    local_4b0 = std::
                _Function_handler<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*),_DebugLogHelper::(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util/logging.h:35:66)>
                ::_M_invoke;
    local_4b8 = std::
                _Function_handler<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*),_DebugLogHelper::(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util/logging.h:35:66)>
                ::_M_manager;
    message_00._M_dataplus._M_p._4_4_ = in_stack_fffffffffffffa3c;
    message_00._M_dataplus._M_p._0_4_ = in_stack_fffffffffffffa38;
    message_00._M_string_length = (size_type)_cVar6;
    message_00.field_2._M_allocated_capacity = lVar3;
    message_00.field_2._8_8_ = in_stack_fffffffffffffa50;
    match_00.super__Function_base._M_functor._8_8_ = in_stack_fffffffffffffa60;
    match_00.super__Function_base._M_functor._M_unused._M_object = in_stack_fffffffffffffa58;
    match_00.super__Function_base._M_manager = in_stack_fffffffffffffa68;
    match_00._M_invoker = (_Invoker_type)in_stack_fffffffffffffa70;
    DebugLogHelper::DebugLogHelper(&local_368,message_00,match_00);
    if (local_4b8 != (code *)0x0) {
      (*local_4b8)(&local_4c8,&local_4c8,3);
    }
    if (local_388[0] != local_378) {
      operator_delete(local_388[0],local_378[0] + 1);
    }
    local_3f8[0] = local_3e8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_3f8,"Error accepting","");
    local_4e8 = 0;
    uStack_4e0 = 0;
    local_4d0 = std::
                _Function_handler<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*),_DebugLogHelper::(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util/logging.h:35:66)>
                ::_M_invoke;
    local_4d8 = std::
                _Function_handler<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*),_DebugLogHelper::(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util/logging.h:35:66)>
                ::_M_manager;
    message_01._M_dataplus._M_p._4_4_ = in_stack_fffffffffffffa3c;
    message_01._M_dataplus._M_p._0_4_ = in_stack_fffffffffffffa38;
    message_01._M_string_length = (size_type)_cVar6;
    message_01.field_2._M_allocated_capacity = lVar3;
    message_01.field_2._8_8_ = in_stack_fffffffffffffa50;
    match_01.super__Function_base._M_functor._8_8_ = in_stack_fffffffffffffa60;
    match_01.super__Function_base._M_functor._M_unused._M_object = in_stack_fffffffffffffa58;
    match_01.super__Function_base._M_manager = in_stack_fffffffffffffa68;
    match_01._M_invoker = (_Invoker_type)in_stack_fffffffffffffa70;
    DebugLogHelper::DebugLogHelper(&local_3d8,message_01,match_01);
    if (local_4d8 != (code *)0x0) {
      (*local_4d8)(&local_4e8,&local_4e8,3);
    }
    if (local_3f8[0] != local_3e8) {
      operator_delete(local_3f8[0],local_3e8[0] + 1);
    }
    local_468[0] = local_458;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_468,"Destroying SAM session","")
    ;
    local_508 = 0;
    uStack_500 = 0;
    local_4f0 = std::
                _Function_handler<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*),_DebugLogHelper::(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util/logging.h:35:66)>
                ::_M_invoke;
    local_4f8 = std::
                _Function_handler<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*),_DebugLogHelper::(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util/logging.h:35:66)>
                ::_M_manager;
    message_02._M_dataplus._M_p._4_4_ = in_stack_fffffffffffffa3c;
    message_02._M_dataplus._M_p._0_4_ = in_stack_fffffffffffffa38;
    message_02._M_string_length = (size_type)_cVar6;
    message_02.field_2._M_allocated_capacity = lVar3;
    message_02.field_2._8_8_ = in_stack_fffffffffffffa50;
    match_02.super__Function_base._M_functor._8_8_ = in_stack_fffffffffffffa60;
    match_02.super__Function_base._M_functor._M_unused._M_object = in_stack_fffffffffffffa58;
    match_02.super__Function_base._M_manager = in_stack_fffffffffffffa68;
    match_02._M_invoker = (_Invoker_type)in_stack_fffffffffffffa70;
    DebugLogHelper::DebugLogHelper(&local_448,message_02,match_02);
    if (local_4f8 != (code *)0x0) {
      (*local_4f8)(&local_508,&local_508,3);
    }
    if (local_468[0] != local_458) {
      operator_delete(local_468[0],local_458[0] + 1);
    }
    local_518 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/i2p_tests.cpp"
    ;
    local_510 = "";
    local_528 = &boost::unit_test::basic_cstring<char_const>::null;
    local_520 = &boost::unit_test::basic_cstring<char_const>::null;
    file.m_end = (iterator)0x80;
    file.m_begin = (iterator)&local_518;
    msg.m_end = in_R9;
    msg.m_begin = in_R8;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_528,msg);
    local_540.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)i2p::sam::Session::Listen((Session *)&local_228,&local_2a8);
    local_540.m_message.px = (element_type *)0x0;
    local_540.m_message.pn.pi_ = (sp_counted_base *)0x0;
    local_570 = "session.Listen(conn)";
    local_568 = "";
    local_560.m_empty = false;
    local_560._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01389048;
    local_550 = boost::unit_test::lazy_ostream::inst;
    local_548 = &local_570;
    local_580 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/i2p_tests.cpp"
    ;
    local_578 = "";
    pvVar4 = (iterator)0x2;
    pvVar5 = (iterator)0x0;
    boost::test_tools::tt_detail::report_assertion
              (&local_540,&local_560,2,0,WARN,_cVar6,(size_t)&local_580,0x80);
    boost::detail::shared_count::~shared_count(&local_540.m_message.pn);
    in_stack_fffffffffffffa70 =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/i2p_tests.cpp"
    ;
    in_stack_fffffffffffffa60 = &boost::unit_test::basic_cstring<char_const>::null;
    in_stack_fffffffffffffa68 = (_Manager_type)&boost::unit_test::basic_cstring<char_const>::null;
    file_00.m_end = (iterator)0x81;
    file_00.m_begin = &stack0xfffffffffffffa70;
    msg_00.m_end = pvVar5;
    msg_00.m_begin = pvVar4;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,
               (size_t)&stack0xfffffffffffffa60,msg_00);
    bVar2 = i2p::sam::Session::Accept((Session *)&local_228,&local_2a8);
    local_540.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)!bVar2;
    local_540.m_message.px = (element_type *)0x0;
    local_540.m_message.pn.pi_ = (sp_counted_base *)0x0;
    local_570 = "!session.Accept(conn)";
    local_568 = "";
    local_560.m_empty = false;
    local_560._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01389048;
    local_550 = boost::unit_test::lazy_ostream::inst;
    local_548 = &local_570;
    in_stack_fffffffffffffa50 =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/i2p_tests.cpp"
    ;
    in_stack_fffffffffffffa58 = "";
    in_stack_fffffffffffffa38 = 0;
    in_stack_fffffffffffffa3c = 0;
    in_R8 = (iterator)0x2;
    in_R9 = (iterator)0x0;
    boost::test_tools::tt_detail::report_assertion
              (&local_540,&local_560,2,0,WARN,_cVar6,(size_t)&stack0xfffffffffffffa50,0x81);
    boost::detail::shared_count::~shared_count(&local_540.m_message.pn);
    DebugLogHelper::~DebugLogHelper(&local_448);
    DebugLogHelper::~DebugLogHelper(&local_3d8);
    DebugLogHelper::~DebugLogHelper(&local_368);
    DebugLogHelper::~DebugLogHelper(&local_2f8);
    lVar3 = lVar3 + -1;
  } while (lVar3 != 0);
  if (0x10 < local_2a8.peer.super_CNetAddr.m_addr._size) {
    free(local_2a8.peer.super_CNetAddr.m_addr._union.indirect_contents.indirect);
    local_2a8.peer.super_CNetAddr.m_addr._union.indirect_contents.indirect = (char *)0x0;
  }
  if (0x10 < local_2a8.me.super_CNetAddr.m_addr._size) {
    free(local_2a8.me.super_CNetAddr.m_addr._union.indirect_contents.indirect);
    local_2a8.me.super_CNetAddr.m_addr._union.indirect_contents.indirect = (char *)0x0;
  }
  if (local_2a8.sock._M_t.super___uniq_ptr_impl<Sock,_std::default_delete<Sock>_>._M_t.
      super__Tuple_impl<0UL,_Sock_*,_std::default_delete<Sock>_>.
      super__Head_base<0UL,_Sock_*,_false>._M_head_impl !=
      (__uniq_ptr_impl<Sock,_std::default_delete<Sock>_>)0x0) {
    (*(*(_func_int ***)
        local_2a8.sock._M_t.super___uniq_ptr_impl<Sock,_std::default_delete<Sock>_>._M_t.
        super__Tuple_impl<0UL,_Sock_*,_std::default_delete<Sock>_>.
        super__Head_base<0UL,_Sock_*,_false>._M_head_impl)[1])();
  }
  i2p::sam::Session::~Session((Session *)&local_228);
  if (local_e8 != &local_d8) {
    operator_delete(local_e8,CONCAT71(local_d8._M_allocated_capacity._1_7_,local_d8._M_local_buf[0])
                             + 1);
  }
  if (0x10 < local_100) {
    free(local_110.indirect_contents.indirect);
  }
  if (0x10 < local_b0) {
    free(local_c0.indirect_contents.indirect);
  }
  std::condition_variable::~condition_variable(&local_98.cond);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(listen_ok_accept_fail)
{
    size_t num_sockets{0};
    CreateSock = [&num_sockets](int, int, int) {
        // clang-format off
        ++num_sockets;
        // First socket is the control socket for creating the session.
        if (num_sockets == 1) {
            return std::make_unique<StaticContentsSock>(
                // reply to HELLO
                "HELLO REPLY RESULT=OK VERSION=3.1\n"
                // reply to DEST GENERATE
                "DEST REPLY PUB=WnGOLXRBqHQhdVjFlWqRxJwz9hxx~2~wGc2Vplta1KhacY4tdEGodCF1WMWVapHEnDP2HHH~b~AZzZWmW1rUqFpxji10Qah0IXVYxZVqkcScM~Yccf9v8BnNlaZbWtSoWnGOLXRBqHQhdVjFlWqRxJwz9hxx~2~wGc2Vplta1KhacY4tdEGodCF1WMWVapHEnDP2HHH~b~AZzZWmW1rUqFpxji10Qah0IXVYxZVqkcScM~Yccf9v8BnNlaZbWtSoWnGOLXRBqHQhdVjFlWqRxJwz9hxx~2~wGc2Vplta1KhacY4tdEGodCF1WMWVapHEnDP2HHH~b~AZzZWmW1rUqFpxji10Qah0IXVYxZVqkcScM~Yccf9v8BnNlaZbWtSoWnGOLXRBqHQhdVjFlWqRxJwz9hxx~2~wGc2Vplta1KhacY4tdEGodCF1WMWVapHEnDP2HHH~b~AZzZWmW1rUqLE4SD-yjT48UNI7qiTUfIPiDitCoiTTz2cr4QGfw89rBQAEAAcAAA== PRIV=WnGOLXRBqHQhdVjFlWqRxJwz9hxx~2~wGc2Vplta1KhacY4tdEGodCF1WMWVapHEnDP2HHH~b~AZzZWmW1rUqFpxji10Qah0IXVYxZVqkcScM~Yccf9v8BnNlaZbWtSoWnGOLXRBqHQhdVjFlWqRxJwz9hxx~2~wGc2Vplta1KhacY4tdEGodCF1WMWVapHEnDP2HHH~b~AZzZWmW1rUqFpxji10Qah0IXVYxZVqkcScM~Yccf9v8BnNlaZbWtSoWnGOLXRBqHQhdVjFlWqRxJwz9hxx~2~wGc2Vplta1KhacY4tdEGodCF1WMWVapHEnDP2HHH~b~AZzZWmW1rUqFpxji10Qah0IXVYxZVqkcScM~Yccf9v8BnNlaZbWtSoWnGOLXRBqHQhdVjFlWqRxJwz9hxx~2~wGc2Vplta1KhacY4tdEGodCF1WMWVapHEnDP2HHH~b~AZzZWmW1rUqLE4SD-yjT48UNI7qiTUfIPiDitCoiTTz2cr4QGfw89rBQAEAAcAAOvuCIKTyv5f~1QgGq7XQl-IqBULTB5WzB3gw5yGPtd1p0AeoADrq1ccZggLPQ4ZLUsGK-HVw373rcTfvxrcuwenqVjiN4tbbYLWtP7xXGWj6fM6HyORhU63GphrjEePpMUHDHXd3o7pWGM-ieVVQSK~1MzF9P93pQWI3Do52EeNAayz4HbpPjNhVBzG1hUEFwznfPmUZBPuaOR4-uBm1NEWEuONlNOCctE4-U0Ukh94z-Qb55U5vXjR5G4apmBblr68t6Wm1TKlzpgFHzSqLryh3stWqrOKY1H0z9eZ2z1EkHFOpD5LyF6nf51e-lV7HLMl44TYzoEHK8RRVodtLcW9lacVdBpv~tOzlZERIiDziZODPETENZMz5oy9DQ7UUw==\n"
                // reply to SESSION CREATE
                "SESSION STATUS RESULT=OK\n"
                // dummy to avoid reporting EOF on the socket
                "a"
            );
        }
        // Subsequent sockets are for recreating the session or for listening and accepting incoming connections.
        if (num_sockets % 2 == 0) {
            // Replies to Listen() and Accept()
            return std::make_unique<StaticContentsSock>(
                // reply to HELLO
                "HELLO REPLY RESULT=OK VERSION=3.1\n"
                // reply to STREAM ACCEPT
                "STREAM STATUS RESULT=OK\n"
                // continued reply to STREAM ACCEPT, violating the protocol described at
                // https://geti2p.net/en/docs/api/samv3#Accept%20Response
                // should be base64, something like
                // "IchV608baDoXbqzQKSqFDmTXPVgoDbPAhZJvNRXXxi4hyFXrTxtoOhdurNApKoUOZNc9WCgNs8CFkm81FdfGLiHIVetPG2g6F26s0CkqhQ5k1z1YKA2zwIWSbzUV18YuIchV608baDoXbqzQKSqFDmTXPVgoDbPAhZJvNRXXxi4hyFXrTxtoOhdurNApKoUOZNc9WCgNs8CFkm81FdfGLiHIVetPG2g6F26s0CkqhQ5k1z1YKA2zwIWSbzUV18YuIchV608baDoXbqzQKSqFDmTXPVgoDbPAhZJvNRXXxi4hyFXrTxtoOhdurNApKoUOZNc9WCgNs8CFkm81FdfGLiHIVetPG2g6F26s0CkqhQ5k1z1YKA2zwIWSbzUV18YuIchV608baDoXbqzQKSqFDmTXPVgoDbPAhZJvNRXXxi4hyFXrTxtoOhdurNApKoUOZNc9WCgNs8CFkm81FdfGLlSreVaCuCS5sdb-8ToWULWP7kt~lRPDeUNxQMq3cRSBBQAEAAcAAA==\n"
                "STREAM STATUS RESULT=I2P_ERROR MESSAGE=\"Session was closed\"\n"
            );
        } else {
            // Another control socket, but without creating a destination (it is cached in the session).
            return std::make_unique<StaticContentsSock>(
                // reply to HELLO
                "HELLO REPLY RESULT=OK VERSION=3.1\n"
                // reply to SESSION CREATE
                "SESSION STATUS RESULT=OK\n"
                // dummy to avoid reporting EOF on the socket
                "a"
            );
        }
        // clang-format on
    };

    CThreadInterrupt interrupt;
    const CService addr{in6_addr(IN6ADDR_LOOPBACK_INIT), /*port=*/7656};
    const Proxy sam_proxy(addr, false);
    i2p::sam::Session session(gArgs.GetDataDirNet() / "test_i2p_private_key",
                              sam_proxy,
                              &interrupt);

    i2p::Connection conn;
    for (size_t i = 0; i < 5; ++i) {
        ASSERT_DEBUG_LOG("Creating persistent SAM session");
        ASSERT_DEBUG_LOG("Persistent SAM session" /* ... created */);
        ASSERT_DEBUG_LOG("Error accepting");
        ASSERT_DEBUG_LOG("Destroying SAM session");
        BOOST_REQUIRE(session.Listen(conn));
        BOOST_REQUIRE(!session.Accept(conn));
    }
}